

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_route.c
# Opt level: O1

int csp_route_security_check(uint32_t security_opts,csp_iface_t *iface,csp_packet_t *packet)

{
  int *piVar1;
  int iVar2;
  long lVar3;
  
  if (((packet->id).flags & 1) == 0) {
    if ((security_opts & 0x40) != 0) goto LAB_00108e37;
LAB_00108e06:
    if (((packet->id).flags & 8) != 0) {
      iVar2 = csp_hmac_verify(packet,false);
      if (iVar2 == 0) goto LAB_00108e13;
LAB_00108e51:
      iVar2 = -100;
      lVar3 = 0x40;
      goto LAB_00108e5b;
    }
    if ((security_opts & 4) != 0) goto LAB_00108e51;
LAB_00108e13:
    if ((security_opts & 1) == 0) {
      return 0;
    }
    if (((packet->id).flags & 2) != 0) {
      return 0;
    }
    iVar2 = -2;
  }
  else {
    iVar2 = csp_crc32_verify(packet);
    if (iVar2 == 0) goto LAB_00108e06;
LAB_00108e37:
    iVar2 = -0x66;
  }
  lVar3 = 0x38;
LAB_00108e5b:
  piVar1 = (int *)((long)&iface->addr + lVar3);
  *piVar1 = *piVar1 + 1;
  return iVar2;
}

Assistant:

static int csp_route_security_check(uint32_t security_opts, csp_iface_t * iface, csp_packet_t * packet) {


	/* CRC32 verified packet */
	if (packet->id.flags & CSP_FCRC32) {
		/* Verify CRC32 (does not include header for backwards compatability with csp1.x) */
		if (csp_crc32_verify(packet) != CSP_ERR_NONE) {
			iface->rx_error++;
			return CSP_ERR_CRC32;
		}
	} else if (security_opts & CSP_SO_CRC32REQ) {
		iface->rx_error++;
		return CSP_ERR_CRC32;
	}

#if (CSP_USE_HMAC)
	/* HMAC authenticated packet */
	if (packet->id.flags & CSP_FHMAC) {
		/* Verify HMAC (does not include header for backwards compatability with csp1.x) */
		if (csp_hmac_verify(packet, false) != CSP_ERR_NONE) {
			/* HMAC failed */
			iface->autherr++;
			return CSP_ERR_HMAC;
		}
	} else if (security_opts & CSP_SO_HMACREQ) {
		iface->autherr++;
		return CSP_ERR_HMAC;
	}
#endif

#if (CSP_USE_RDP)
	/* RDP packet */
	if (!(packet->id.flags & CSP_FRDP)) {
		if (security_opts & CSP_SO_RDPREQ) {
			iface->rx_error++;
			return CSP_ERR_INVAL;
		}
	}
#endif

	return CSP_ERR_NONE;
}